

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_ManCnfAddDynamic(Ga2_Man_t *p,int uTruth,int *Lits,int iLitOut,int ProofId)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int ClaLits [6];
  
  uVar2 = 0;
  do {
    if (uVar2 == 2) {
      return;
    }
    uVar7 = ~uTruth & 0xffff;
    if (uVar2 == 0) {
      uVar7 = uTruth;
    }
    uTruth = uVar7;
    uVar7 = uVar2 ^ iLitOut;
    for (lVar5 = 0; lVar5 < p->pSopSizes[(uint)uTruth]; lVar5 = lVar5 + 1) {
      uVar3 = 3;
      iVar6 = 1;
      iVar1 = (int)p->pSops[(uint)uTruth][lVar5];
      while( true ) {
        ClaLits[0] = uVar7;
        if ((int)uVar3 < 0) break;
        if (iVar1 % 3 == 1) {
          if (Lits[uVar3] < 2) {
            __assert_fail("Lits[b] > 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                          ,0x2a3,"void Ga2_ManCnfAddDynamic(Ga2_Man_t *, int, int *, int, int)");
          }
          uVar4 = Lits[uVar3] ^ 1;
LAB_0049f18a:
          ClaLits[iVar6] = uVar4;
          iVar6 = iVar6 + 1;
        }
        else if (iVar1 % 3 == 0) {
          uVar4 = Lits[uVar3];
          if ((int)uVar4 < 2) {
            __assert_fail("Lits[b] > 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                          ,0x29e,"void Ga2_ManCnfAddDynamic(Ga2_Man_t *, int, int *, int, int)");
          }
          goto LAB_0049f18a;
        }
        uVar3 = (ulong)((int)uVar3 - 1);
        iVar1 = iVar1 / 3;
      }
      sat_solver2_addclause(p->pSat,ClaLits,ClaLits + iVar6,ProofId);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static inline void Ga2_ManCnfAddDynamic( Ga2_Man_t * p, int uTruth, int Lits[], int iLitOut, int ProofId )
{
    int i, k, b, Cube, nClaLits, ClaLits[6];
//    assert( uTruth > 0 && uTruth < 0xffff );
    for ( i = 0; i < 2; i++ )
    {
        if ( i )
            uTruth = 0xffff & ~uTruth;
//        Extra_PrintBinary( stdout, &uTruth, 16 ); printf( "\n" );
        for ( k = 0; k < p->pSopSizes[uTruth]; k++ )
        {
            nClaLits = 0;
            ClaLits[nClaLits++] = i ? lit_neg(iLitOut) : iLitOut;
            Cube = p->pSops[uTruth][k];
            for ( b = 3; b >= 0; b-- )
            {
                if ( Cube % 3 == 0 ) // value 0 --> add positive literal
                {
                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = Lits[b];
                }
                else if ( Cube % 3 == 1 ) // value 1 --> add negative literal
                {
                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = lit_neg(Lits[b]);
                }
                Cube = Cube / 3;
            }
            sat_solver2_addclause( p->pSat, ClaLits, ClaLits+nClaLits, ProofId );
        }
    }
}